

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio.cc
# Opt level: O1

size_t docio_batch_read_docs
                 (docio_handle *handle,uint64_t *offset_array,docio_object *doc_array,
                 size_t array_size,size_t data_size_threshold,size_t batch_size_threshold,
                 async_io_handle *aio_handle,bool keymeta_only)

{
  docio_object *doc;
  docio_object *pdVar1;
  uint32_t uVar2;
  uint uVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  void **ppvVar9;
  size_t sVar10;
  
  if (batch_size_threshold <= array_size) {
    array_size = batch_size_threshold;
  }
  if (data_size_threshold == 0 || array_size == 0) {
    sVar10 = 0;
    bVar4 = false;
LAB_001296af:
    if ((bVar4) && (sVar10 = 0xffffffffffffffff, batch_size_threshold != 0)) {
      ppvVar9 = &doc_array->key;
      do {
        free(*ppvVar9);
        free(ppvVar9[2]);
        free(ppvVar9[3]);
        *ppvVar9 = (void *)0x0;
        ppvVar9[2] = (void *)0x0;
        ppvVar9[3] = (void *)0x0;
        ppvVar9 = ppvVar9 + 7;
        batch_size_threshold = batch_size_threshold - 1;
      } while (batch_size_threshold != 0);
    }
    return sVar10;
  }
  iVar8 = 0;
  uVar2 = handle->file->blocksize;
  uVar7 = 1;
  sVar10 = 0;
  uVar6 = 0;
  do {
    doc = doc_array + sVar10;
    doc_array[sVar10].field_3.seqnum = 0;
    (&doc_array[sVar10].field_3)[1].seqnum = 0;
    *(undefined8 *)&doc_array[sVar10].timestamp = 0;
    *(void **)(&doc_array[sVar10].timestamp + 2) = (void *)0x0;
    pdVar1 = doc_array + sVar10;
    (pdVar1->length).keylen = 0;
    (pdVar1->length).metalen = 0;
    (pdVar1->length).bodylen = 0;
    (pdVar1->length).bodylen_ondisk = 0;
    (pdVar1->length).flag = '\0';
    (pdVar1->length).checksum = '\0';
    (pdVar1->length).reserved = 0;
    doc_array[sVar10].body = (void *)0x0;
    if (keymeta_only) {
      lVar5 = docio_read_doc_key_meta
                        (handle,offset_array[uVar7 - 1],doc,aio_handle == (async_io_handle *)0x0);
    }
    else {
      lVar5 = docio_read_doc(handle,offset_array[uVar7 - 1],doc,aio_handle == (async_io_handle *)0x0
                            );
    }
    if (lVar5 == 0) {
      if (aio_handle == (async_io_handle *)0x0) goto LAB_00129683;
      (*handle->file->ops->aio_prep_read)
                (aio_handle,(long)iVar8,(size_t)uVar2,offset_array[uVar7 - 1]);
      iVar8 = iVar8 + 1;
      if ((iVar8 == (int)aio_handle->queue_depth) && (iVar8 != 0)) {
        bVar4 = true;
        goto LAB_001296af;
      }
    }
    else {
      uVar3._0_2_ = (doc->length).keylen;
      uVar3._2_2_ = (doc->length).metalen;
      uVar6 = uVar6 + ((uVar3 & 0xffff) + (uVar3 >> 0x10) + (doc->length).bodylen_ondisk) + 0x20;
      if (keymeta_only) {
        uVar6 = uVar6 - (doc->length).bodylen_ondisk;
      }
LAB_00129683:
      sVar10 = sVar10 + 1;
    }
    bVar4 = false;
    if ((array_size <= uVar7) || (uVar7 = uVar7 + 1, data_size_threshold <= uVar6))
    goto LAB_001296af;
  } while( true );
}

Assistant:

size_t docio_batch_read_docs(struct docio_handle *handle,
                             uint64_t *offset_array,
                             struct docio_object *doc_array,
                             size_t array_size,
                             size_t data_size_threshold,
                             size_t batch_size_threshold,
                             struct async_io_handle *aio_handle,
                             bool keymeta_only)
{
    size_t i = 0;
    size_t sum_doc_size = 0;
    size_t doc_idx = 0;
    size_t block_size = handle->file->blocksize;
    uint64_t _offset = 0;
    int aio_size = 0;
    bool read_fail = false;
    bool read_on_cache_miss = true;

    if (aio_handle) {
        // If async I/O is supported, we will then read non-resident docs from disk
        // by using async I/O operations.
        read_on_cache_miss = false;
    }

    for (i = 0; i < array_size && i < batch_size_threshold &&
           sum_doc_size < data_size_threshold; ++i) {
        memset(&doc_array[doc_idx], 0x0, sizeof(struct docio_object));
        if (keymeta_only) {
            _offset = docio_read_doc_key_meta(handle, offset_array[i], &doc_array[doc_idx],
                                              read_on_cache_miss);
        } else {
            _offset = docio_read_doc(handle, offset_array[i], &doc_array[doc_idx],
                                     read_on_cache_miss);
        }
        if (_offset <= 0) {
            if (aio_handle) {
                // The page is not resident in the cache. Prepare and perform Async I/O
                handle->file->ops->aio_prep_read(aio_handle, aio_size,
                                                 block_size, offset_array[i]);
                if (++aio_size == (int) aio_handle->queue_depth) {
                    int num_sub = _submit_async_io_requests(handle, doc_array, doc_idx,
                                                            aio_handle, aio_size,
                                                            &sum_doc_size,
                                                            keymeta_only);
                    if (num_sub < 0 || num_sub != aio_size) {
                        read_fail = true;
                        break;
                    }
                    aio_size = 0;
                    doc_idx += num_sub;
                }
            } else {
                ++doc_idx; // Error in reading a doc.
            }
        } else {
            sum_doc_size += _fdb_get_docsize(doc_array[doc_idx].length);
            if (keymeta_only) {
                sum_doc_size -= doc_array[doc_idx].length.bodylen_ondisk;
            }
            ++doc_idx;
        }
    }

    if (aio_size && !read_fail) {
        int num_sub = _submit_async_io_requests(handle, doc_array, doc_idx,
                                                aio_handle, aio_size,
                                                &sum_doc_size, keymeta_only);
        if (num_sub < 0) {
            read_fail = true;
        } else {
            doc_idx += num_sub;
        }
    }

    if (read_fail) {
        for (i = 0; i < batch_size_threshold; ++i) {
            free(doc_array[i].key);
            free(doc_array[i].meta);
            free(doc_array[i].body);
            doc_array[i].key = doc_array[i].meta = doc_array[i].body = NULL;
        }
        return (size_t) -1;
    }

    return doc_idx;
}